

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

bool ungroup_active_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  undefined1 local_68 [8];
  Am_Value is_group;
  Am_Object obj;
  undefined1 local_48 [8];
  Am_Value_List selected_objs;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object selection_widget;
  Am_Object *self_local;
  
  selection_widget.data = (Am_Object_Data *)self;
  Am_Object::Am_Object(&local_28,self);
  Am_Get_Selection_Widget_For_Command(&local_20);
  Am_Object::~Am_Object(&local_28);
  bVar1 = Am_Object::Valid(&local_20);
  if (bVar1) {
    pAVar2 = Am_Object::Get(&local_20,0x169,0);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_48,pAVar2);
    bVar1 = Am_Value_List::Empty((Am_Value_List *)local_48);
    if (bVar1) {
      self_local._7_1_ = false;
    }
    else {
      Am_Object::Am_Object((Am_Object *)&is_group.value);
      Am_Value::Am_Value((Am_Value *)local_68);
      Am_Value_List::Start((Am_Value_List *)local_48);
      while( true ) {
        bVar1 = Am_Value_List::Last((Am_Value_List *)local_48);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        pAVar2 = Am_Value_List::Get((Am_Value_List *)local_48);
        Am_Object::operator=((Am_Object *)&is_group.value,pAVar2);
        pAVar2 = Am_Object::Peek((Am_Object *)&is_group.value,0x1e6,4);
        Am_Value::operator=((Am_Value *)local_68,pAVar2);
        bVar1 = Am_Value::Valid((Am_Value *)local_68);
        if (!bVar1) {
          self_local._7_1_ = false;
          goto LAB_0031e5d5;
        }
        Am_Value_List::Next((Am_Value_List *)local_48);
      }
      self_local._7_1_ =
           Am_Check_All_Objects_For_Inactive_Slot
                     ((Am_Value_List *)local_48,(Am_Object *)selection_widget.data);
LAB_0031e5d5:
      Am_Value::~Am_Value((Am_Value *)local_68);
      Am_Object::~Am_Object((Am_Object *)&is_group.value);
    }
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_48);
  }
  else {
    self_local._7_1_ = false;
  }
  Am_Object::~Am_Object(&local_20);
  return self_local._7_1_;
}

Assistant:

Am_Define_Formula(bool, ungroup_active)
{
  Am_Object selection_widget = Am_Get_Selection_Widget_For_Command(self);
  if (selection_widget.Valid()) {
    Am_Value_List selected_objs = selection_widget.Get(Am_VALUE);
    if (selected_objs.Empty())
      return false;
    Am_Object obj;
    Am_Value is_group;
    for (selected_objs.Start(); !selected_objs.Last(); selected_objs.Next()) {
      obj = selected_objs.Get();
      is_group = obj.Peek(Am_CREATED_GROUP,
                          Am_NO_DEPENDENCY); //don't need GV since won't change
      if (!is_group.Valid())
        return false;
    }
    return Am_Check_All_Objects_For_Inactive_Slot(selected_objs, self);
  } else
    return false;
}